

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

void filter_init_all(void)

{
  return;
}

Assistant:

void
filter_init_all(void)
{
#define FILTER_INIT(filt) do { \
    if (filt.libkqueue_init) \
        filt.libkqueue_init(); \
} while (0)

    FILTER_INIT(evfilt_read);
    FILTER_INIT(evfilt_write);
    FILTER_INIT(evfilt_signal);
    FILTER_INIT(evfilt_vnode);
    FILTER_INIT(evfilt_proc);
    FILTER_INIT(evfilt_timer);
    FILTER_INIT(evfilt_user);
    FILTER_INIT(evfilt_libkqueue);
}